

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::SignCase::getInputValues(SignCase *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer pSVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  deUint32 dVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  float fVar17;
  int iVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  Random rnd;
  deRandom local_78;
  int local_68 [8];
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -10000.0;
  local_48[3] = 10000.0;
  local_48[4] = -1e+08;
  local_48[5] = 1e+08;
  local_68[0] = -0x80;
  local_68[1] = 0x7f;
  local_68[2] = -0x8000;
  local_68[3] = 0x7fff;
  local_68[4] = -0x80000000;
  local_68[5] = 0x7fffffff;
  dVar8 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_78,dVar8 ^ 0x324);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar15 = (ulong)(pSVar3->varType).m_data.basic.precision;
  iVar9 = glu::getDataTypeScalarSize(dataType);
  auVar7 = _DAT_01a25df0;
  auVar6 = _DAT_019fcc00;
  auVar5 = _DAT_019f5ce0;
  lVar10 = (long)iVar9;
  lVar14 = lVar10 * 4;
  pvVar4 = *values;
  if (dataType - TYPE_FLOAT < 4) {
    if (iVar9 != 0) {
      uVar11 = lVar14 - 4;
      auVar18._8_4_ = (int)uVar11;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = (int)(uVar11 >> 0x20);
      auVar19._0_8_ = uVar11 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_019f5ce0;
      do {
        auVar24._8_4_ = (int)uVar12;
        auVar24._0_8_ = uVar12;
        auVar24._12_4_ = (int)(uVar12 >> 0x20);
        auVar27 = (auVar24 | auVar6) ^ auVar5;
        iVar23 = auVar19._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar23 && auVar19._0_4_ < auVar27._0_4_ ||
                    iVar23 < auVar27._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4) = 0x3f800000;
        }
        if ((auVar27._12_4_ != auVar19._12_4_ || auVar27._8_4_ <= auVar19._8_4_) &&
            auVar27._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 4) = 0x3f800000;
        }
        auVar27 = (auVar24 | auVar7) ^ auVar5;
        iVar28 = auVar27._4_4_;
        if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar27._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 8) = 0x3f800000;
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 0xc) = 0x3f800000;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar11 >> 2) + 4 & 0x7ffffffffffffffc) != uVar12);
    }
    auVar7 = _DAT_01a25df0;
    auVar6 = _DAT_019fcc00;
    auVar5 = _DAT_019f5ce0;
    lVar13 = (long)(iVar9 * 2);
    if (lVar14 + lVar13 * -4 != 0) {
      uVar12 = (lVar13 * 4 + lVar10 * -4) - 4;
      auVar20._8_4_ = (int)uVar12;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      auVar21._0_8_ = uVar12 >> 2;
      auVar21._8_8_ = auVar20._8_8_ >> 2;
      uVar11 = 0;
      auVar21 = auVar21 ^ _DAT_019f5ce0;
      do {
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        auVar27 = (auVar25 | auVar6) ^ auVar5;
        iVar23 = auVar21._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar23 && auVar21._0_4_ < auVar27._0_4_ ||
                    iVar23 < auVar27._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + lVar14) = 0xbf800000;
        }
        if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
            auVar27._12_4_ <= auVar21._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + lVar14 + 4) = 0xbf800000;
        }
        auVar27 = (auVar25 | auVar7) ^ auVar5;
        iVar28 = auVar27._4_4_;
        if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar27._0_4_ <= auVar21._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + lVar14 + 8) = 0xbf800000;
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + lVar14 + 0xc) = 0xbf800000;
        }
        uVar11 = uVar11 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar11);
    }
    lVar14 = (long)(iVar9 * 3);
    if (lVar13 * 4 + lVar14 * -4 != 0) {
      memset((void *)((long)pvVar4 + lVar13 * 4),0,lVar14 * 4 + lVar13 * -4);
    }
    uVar16 = iVar9 * (numValues + -3);
    if (0 < (int)uVar16) {
      fVar1 = local_48[uVar15 * 2];
      fVar2 = local_48[uVar15 * 2 + 1];
      uVar15 = 0;
      do {
        fVar17 = deRandom_getFloat(&local_78);
        *(float *)((long)pvVar4 + uVar15 * 4 + lVar14 * 4) = fVar17 * (fVar2 - fVar1) + fVar1;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
  }
  else {
    if (iVar9 != 0) {
      uVar11 = lVar14 - 4;
      auVar27._8_4_ = (int)uVar11;
      auVar27._0_8_ = uVar11;
      auVar27._12_4_ = (int)(uVar11 >> 0x20);
      auVar22._0_8_ = uVar11 >> 2;
      auVar22._8_8_ = auVar27._8_8_ >> 2;
      uVar12 = 0;
      auVar22 = auVar22 ^ _DAT_019f5ce0;
      do {
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar27 = (auVar26 | auVar6) ^ auVar5;
        iVar23 = auVar22._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar23 && auVar22._0_4_ < auVar27._0_4_ ||
                    iVar23 < auVar27._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4) = 1;
        }
        if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
            auVar27._12_4_ <= auVar22._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 4) = 1;
        }
        auVar27 = (auVar26 | auVar7) ^ auVar5;
        iVar28 = auVar27._4_4_;
        if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar27._0_4_ <= auVar22._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 8) = 1;
          *(undefined4 *)((long)pvVar4 + uVar12 * 4 + 0xc) = 1;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
    }
    lVar13 = (long)(iVar9 * 2);
    if (lVar14 + lVar13 * -4 != 0) {
      memset((void *)((long)pvVar4 + lVar10 * 4),0xff,lVar13 * 4 + lVar10 * -4);
    }
    lVar14 = (long)(iVar9 * 3);
    if (lVar13 * 4 + lVar14 * -4 != 0) {
      memset((void *)((long)pvVar4 + lVar13 * 4),0,lVar14 * 4 + lVar13 * -4);
    }
    uVar16 = iVar9 * (numValues + -3);
    if (0 < (int)uVar16) {
      iVar9 = local_68[uVar15 * 2];
      iVar23 = local_68[uVar15 * 2 + 1];
      uVar15 = 0;
      do {
        dVar8 = deRandom_getUint32(&local_78);
        if (iVar23 != 0x7fffffff || iVar9 != -0x80000000) {
          dVar8 = dVar8 % ((iVar23 - iVar9) + 1U) + iVar9;
        }
        *(deUint32 *)((long)pvVar4 + uVar15 * 4 + lVar14 * 4) = dVar8;
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(getName()) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0],				(float*)values[0] + scalarSize,		+1.0f);
			std::fill((float*)values[0] + scalarSize*1,	(float*)values[0] + scalarSize*2,	-1.0f);
			std::fill((float*)values[0] + scalarSize*2,	(float*)values[0] + scalarSize*3,	0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0],					(int*)values[0] + scalarSize,		+1);
			std::fill((int*)values[0] + scalarSize*1,	(int*)values[0] + scalarSize*2,		-1);
			std::fill((int*)values[0] + scalarSize*2,	(int*)values[0] + scalarSize*3,		0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}